

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_verboseconnect(connectdata *conn)

{
  char *local_30;
  char *local_28;
  char *local_20;
  connectdata *conn_local;
  
  if (((conn->data->set).verbose & 1U) != 0) {
    if (((conn->bits).socksproxy & 1U) == 0) {
      if (((conn->bits).httpproxy & 1U) == 0) {
        if (((conn->bits).conn_to_host & 1U) == 0) {
          local_30 = (conn->host).dispname;
        }
        else {
          local_30 = (conn->conn_to_host).dispname;
        }
        local_28 = local_30;
      }
      else {
        local_28 = (conn->http_proxy).host.dispname;
      }
      local_20 = local_28;
    }
    else {
      local_20 = (conn->socks_proxy).host.dispname;
    }
    Curl_infof(conn->data,"Connected to %s (%s) port %ld (#%ld)\n",local_20,conn->ip_addr_str,
               conn->port,conn->connection_id);
  }
  return;
}

Assistant:

void Curl_verboseconnect(struct connectdata *conn)
{
  if(conn->data->set.verbose)
    infof(conn->data, "Connected to %s (%s) port %ld (#%ld)\n",
          conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
          conn->bits.httpproxy ? conn->http_proxy.host.dispname :
          conn->bits.conn_to_host ? conn->conn_to_host.dispname :
          conn->host.dispname,
          conn->ip_addr_str, conn->port, conn->connection_id);
}